

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall slang::ast::TypeArgFormatter::startMessage(TypeArgFormatter *this,Diagnostic *diag)

{
  size_t *psVar1;
  char *pcVar2;
  group_type_pointer pgVar3;
  string_view *sv;
  undefined4 uVar4;
  Type *pTVar5;
  size_t __n;
  group_type_pointer pgVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  TypeArgFormatter *pTVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  ulong *puVar15;
  uint64_t hash;
  value_type *elements;
  pointer pvVar16;
  undefined1 *this_00;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  pointer pvVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  value_type_pointer unaff_R12;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
  *ppVar25;
  pointer pvVar26;
  value_type_pointer ppTVar27;
  bool bVar28;
  uchar uVar29;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  undefined1 auVar30 [16];
  char cVar34;
  char cVar37;
  char cVar38;
  char cVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  try_emplace_args_t local_191;
  TypeArgFormatter *local_190;
  Type *local_188;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
  *local_180;
  pointer local_178;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
  *local_170;
  value_type_pointer local_168;
  locator res;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>_>
  typeNames;
  
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::clear((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           *)&this->seenTypes);
  local_170 = (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
               *)&this->typesToDisambiguate;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
  ::clear((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Type_*,_void>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
           *)local_170);
  typeNames.super_Storage.ptr = (char *)&typeNames;
  typeNames._112_8_ = 0x3f;
  typeNames._120_8_ = 1;
  typeNames._136_8_ = 0;
  uVar13 = typeNames._136_8_;
  typeNames._128_8_ =
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  typeNames._136_8_ = 0;
  typeNames._144_8_ = 0;
  typeNames._152_8_ = 0;
  pvVar16 = (diag->args).
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar26 = (diag->args).
            super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  typeNames.super_Storage._104_8_ = typeNames.super_Storage.ptr;
  if (pvVar16 != pvVar26) {
    do {
      if (pvVar16 == (pointer)0x0) {
        pvVar20 = (pointer)0x0;
      }
      else {
        pvVar20 = (pointer)0x0;
        if ((pvVar16->
            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
            ).
            super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
            .
            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
            .
            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
            .
            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
            .
            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
            ._M_index == '\x05') {
          pvVar20 = pvVar16;
        }
      }
      if (((pvVar20 != (pointer)0x0) &&
          (puVar15 = (ulong *)std::__any_caster<slang::ast::Type_const*>
                                        ((any *)((long)&(pvVar20->
                                                                                                                
                                                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  ).
                                                  super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  .
                                                  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                                                  ._M_u + 8)), puVar15 != (ulong *)0x0)) &&
         (pTVar5 = (Type *)*puVar15, local_168 = unaff_R12, (pTVar5->super_Symbol).kind == TypeAlias
         )) {
        sv = &(pTVar5->super_Symbol).name;
        local_188 = pTVar5;
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &typeNames.super_Storage.field_0x68,sv);
        uVar12 = typeNames._136_8_;
        uVar11 = typeNames._128_8_;
        uVar13 = typeNames._120_8_;
        uVar17 = hash >> (typeNames._112_1_ & 0x3f);
        uVar4 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
        uVar23 = 0;
        uVar19 = uVar17;
        local_190 = this;
        local_178 = pvVar26;
        do {
          pcVar2 = (char *)(uVar11 + uVar19 * 0x10);
          cVar34 = (char)uVar4;
          auVar30[0] = -(*pcVar2 == cVar34);
          cVar37 = (char)((uint)uVar4 >> 8);
          auVar30[1] = -(pcVar2[1] == cVar37);
          cVar38 = (char)((uint)uVar4 >> 0x10);
          auVar30[2] = -(pcVar2[2] == cVar38);
          cVar39 = (char)((uint)uVar4 >> 0x18);
          auVar30[3] = -(pcVar2[3] == cVar39);
          auVar30[4] = -(pcVar2[4] == cVar34);
          auVar30[5] = -(pcVar2[5] == cVar37);
          auVar30[6] = -(pcVar2[6] == cVar38);
          auVar30[7] = -(pcVar2[7] == cVar39);
          auVar30[8] = -(pcVar2[8] == cVar34);
          auVar30[9] = -(pcVar2[9] == cVar37);
          auVar30[10] = -(pcVar2[10] == cVar38);
          auVar30[0xb] = -(pcVar2[0xb] == cVar39);
          auVar30[0xc] = -(pcVar2[0xc] == cVar34);
          auVar30[0xd] = -(pcVar2[0xd] == cVar37);
          auVar30[0xe] = -(pcVar2[0xe] == cVar38);
          auVar30[0xf] = -(pcVar2[0xf] == cVar39);
          uVar22 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
          if (uVar22 != 0) {
            __n = (pTVar5->super_Symbol).name._M_len;
            pcVar2 = (pTVar5->super_Symbol).name._M_str;
            do {
              uVar7 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              ppVar25 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
                         *)(uVar12 + uVar19 * 0x168 + (ulong)uVar7 * 0x18);
              bVar28 = __n == (ppVar25->first)._M_len;
              if (bVar28 && __n != 0) {
                iVar14 = bcmp(pcVar2,(ppVar25->first)._M_str,__n);
                bVar28 = iVar14 == 0;
              }
              pvVar26 = local_178;
              this = local_190;
              if (bVar28) goto LAB_0044ba46;
              uVar22 = uVar22 - 1 & uVar22;
            } while (uVar22 != 0);
          }
          if ((*(byte *)(uVar19 * 0x10 + uVar11 + 0xf) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
          lVar18 = uVar19 + uVar23;
          uVar23 = uVar23 + 1;
          uVar19 = lVar18 + 1U & uVar13;
        } while (uVar23 <= (ulong)uVar13);
        local_180 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
                     *)0x0;
        ppVar25 = local_180;
LAB_0044ba46:
        local_180 = ppVar25;
        this_00 = &typeNames.super_Storage.field_0x68;
        ppVar25 = local_180;
        if (local_180 ==
            (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
             *)0x0) {
          if ((ulong)typeNames._152_8_ < (ulong)typeNames._144_8_) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Type_const*>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
                             *)this_00,(arrays_type *)&typeNames.field_0x70,uVar17,hash,&local_191,
                       sv,&local_188);
            typeNames._152_8_ = typeNames._152_8_ + 1;
            ppVar25 = res.p;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Type_const*>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Type_const*>,96ul,16ul>>
                             *)this_00,hash,&local_191,sv,&local_188);
            ppVar25 = res.p;
          }
        }
        pTVar10 = local_190;
        unaff_R12 = local_168;
        if (local_180 !=
            (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
             *)0x0) {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = pTVar5;
          uVar21 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar23 = uVar21 >> ((byte)(this->typesToDisambiguate).table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                                    .arrays.groups_size_index & 0x3f);
          pgVar6 = (this->typesToDisambiguate).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                   .arrays.groups_;
          uVar4 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar21 & 0xff];
          ppTVar27 = (this->typesToDisambiguate).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                     .arrays.elements_;
          uVar19 = (this->typesToDisambiguate).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                   .arrays.groups_size_mask;
          uVar24 = 0;
          uVar17 = uVar23;
          do {
            pgVar3 = pgVar6 + uVar17;
            uVar29 = (uchar)uVar4;
            auVar35[0] = -(pgVar3->m[0].n == uVar29);
            uVar31 = (uchar)((uint)uVar4 >> 8);
            auVar35[1] = -(pgVar3->m[1].n == uVar31);
            uVar32 = (uchar)((uint)uVar4 >> 0x10);
            auVar35[2] = -(pgVar3->m[2].n == uVar32);
            uVar33 = (uchar)((uint)uVar4 >> 0x18);
            auVar35[3] = -(pgVar3->m[3].n == uVar33);
            auVar35[4] = -(pgVar3->m[4].n == uVar29);
            auVar35[5] = -(pgVar3->m[5].n == uVar31);
            auVar35[6] = -(pgVar3->m[6].n == uVar32);
            auVar35[7] = -(pgVar3->m[7].n == uVar33);
            auVar35[8] = -(pgVar3->m[8].n == uVar29);
            auVar35[9] = -(pgVar3->m[9].n == uVar31);
            auVar35[10] = -(pgVar3->m[10].n == uVar32);
            auVar35[0xb] = -(pgVar3->m[0xb].n == uVar33);
            auVar35[0xc] = -(pgVar3->m[0xc].n == uVar29);
            auVar35[0xd] = -(pgVar3->m[0xd].n == uVar31);
            auVar35[0xe] = -(pgVar3->m[0xe].n == uVar32);
            auVar35[0xf] = -(pgVar3->m[0xf].n == uVar33);
            for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe); uVar22 != 0
                ; uVar22 = uVar22 - 1 & uVar22) {
              uVar7 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              if (pTVar5 == ppTVar27[uVar17 * 0xf + (ulong)uVar7]) {
                ppTVar27 = ppTVar27 + uVar17 * 0xf + (ulong)uVar7;
                goto LAB_0044bbb1;
              }
            }
            if ((pgVar6[uVar17].m[0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7]) == 0) {
              ppTVar27 = (value_type_pointer)0x0;
              goto LAB_0044bbb1;
            }
            lVar18 = uVar17 + uVar24;
            uVar24 = uVar24 + 1;
            uVar17 = lVar18 + 1U & uVar19;
          } while (uVar24 <= uVar19);
          ppTVar27 = (value_type_pointer)0x0;
LAB_0044bbb1:
          local_188 = pTVar5;
          if (ppTVar27 == (value_type_pointer)0x0) {
            if ((local_190->typesToDisambiguate).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                .size_ctrl.size <
                (local_190->typesToDisambiguate).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
              ::nosize_unchecked_emplace_at<slang::ast::Type_const*>
                        ((locator *)&res,local_170,(arrays_type *)local_170,uVar23,uVar21,&local_188
                        );
              psVar1 = &(pTVar10->typesToDisambiguate).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                        .size_ctrl.size;
              *psVar1 = *psVar1 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
              ::unchecked_emplace_with_rehash<slang::ast::Type_const*>
                        ((locator *)&res,local_170,uVar21,&local_188);
            }
          }
          pvVar26 = local_178;
          this = local_190;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = ppVar25->second;
          uVar21 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar23 = uVar21 >> ((byte)(pTVar10->typesToDisambiguate).table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                                    .arrays.groups_size_index & 0x3f);
          pgVar6 = (pTVar10->typesToDisambiguate).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                   .arrays.groups_;
          uVar4 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar21 & 0xff];
          ppTVar27 = (pTVar10->typesToDisambiguate).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                     .arrays.elements_;
          uVar19 = (pTVar10->typesToDisambiguate).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                   .arrays.groups_size_mask;
          uVar24 = 0;
          uVar17 = uVar23;
          do {
            pgVar3 = pgVar6 + uVar17;
            uVar29 = (uchar)uVar4;
            auVar36[0] = -(pgVar3->m[0].n == uVar29);
            uVar31 = (uchar)((uint)uVar4 >> 8);
            auVar36[1] = -(pgVar3->m[1].n == uVar31);
            uVar32 = (uchar)((uint)uVar4 >> 0x10);
            auVar36[2] = -(pgVar3->m[2].n == uVar32);
            uVar33 = (uchar)((uint)uVar4 >> 0x18);
            auVar36[3] = -(pgVar3->m[3].n == uVar33);
            auVar36[4] = -(pgVar3->m[4].n == uVar29);
            auVar36[5] = -(pgVar3->m[5].n == uVar31);
            auVar36[6] = -(pgVar3->m[6].n == uVar32);
            auVar36[7] = -(pgVar3->m[7].n == uVar33);
            auVar36[8] = -(pgVar3->m[8].n == uVar29);
            auVar36[9] = -(pgVar3->m[9].n == uVar31);
            auVar36[10] = -(pgVar3->m[10].n == uVar32);
            auVar36[0xb] = -(pgVar3->m[0xb].n == uVar33);
            auVar36[0xc] = -(pgVar3->m[0xc].n == uVar29);
            auVar36[0xd] = -(pgVar3->m[0xd].n == uVar31);
            auVar36[0xe] = -(pgVar3->m[0xe].n == uVar32);
            auVar36[0xf] = -(pgVar3->m[0xf].n == uVar33);
            for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe); uVar22 != 0
                ; uVar22 = uVar22 - 1 & uVar22) {
              uVar7 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              if (ppVar25->second == ppTVar27[uVar17 * 0xf + (ulong)uVar7]) {
                unaff_R12 = ppTVar27 + uVar17 * 0xf + (ulong)uVar7;
                local_168 = unaff_R12;
                goto LAB_0044bd06;
              }
            }
            if ((pgVar6[uVar17].m[0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7]) == 0) {
              unaff_R12 = (value_type_pointer)0x0;
              goto LAB_0044bd06;
            }
            lVar18 = uVar17 + uVar24;
            uVar24 = uVar24 + 1;
            uVar17 = lVar18 + 1U & uVar19;
          } while (uVar24 <= uVar19);
          unaff_R12 = (value_type_pointer)0x0;
LAB_0044bd06:
          if (unaff_R12 == (value_type_pointer)0x0) {
            if ((local_190->typesToDisambiguate).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                .size_ctrl.size <
                (local_190->typesToDisambiguate).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
              ::nosize_unchecked_emplace_at<slang::ast::Type_const*const&>
                        ((locator *)&res,local_170,(arrays_type *)local_170,uVar23,uVar21,
                         &ppVar25->second);
              psVar1 = &(this->typesToDisambiguate).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::Type_*>,_slang::hash<const_slang::ast::Type_*>,_std::equal_to<const_slang::ast::Type_*>,_std::allocator<const_slang::ast::Type_*>_>
                        .size_ctrl.size;
              *psVar1 = *psVar1 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Type_const*,void>,std::equal_to<slang::ast::Type_const*>,std::allocator<slang::ast::Type_const*>>
              ::unchecked_emplace_with_rehash<slang::ast::Type_const*const&>
                        ((locator *)&res,local_170,uVar21,&ppVar25->second);
            }
          }
        }
      }
      pvVar16 = pvVar16 + 1;
      uVar13 = typeNames._136_8_;
    } while (pvVar16 != pvVar26);
  }
  typeNames._136_8_ = uVar13;
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)typeNames.super_Storage._104_8_
  ;
  if (typeNames._136_8_ != 0) {
    slang::detail::hashing::
    StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>
    ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>,_96UL,_16UL>
                  *)&res,(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Type_*>
                          *)typeNames._136_8_,(typeNames._120_8_ * 0x178 + 0x186U) / 0x18);
  }
  return;
}

Assistant:

void TypeArgFormatter::startMessage(const Diagnostic& diag) {
    seenTypes.clear();
    typesToDisambiguate.clear();

    SmallMap<std::string_view, const Type*, 4> typeNames;
    for (auto& arg : diag.args) {
        if (auto customArg = std::get_if<Diagnostic::CustomArgType>(&arg)) {
            if (auto typePtr = std::any_cast<const Type*>(&customArg->second)) {
                auto& type = **typePtr;
                if (type.isAlias()) {
                    auto [it, inserted] = typeNames.emplace(type.name, &type);
                    if (!inserted) {
                        typesToDisambiguate.insert(&type);
                        typesToDisambiguate.insert(it->second);
                    }
                }
            }
        }
    }
}